

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O1

bool crnlib::uint_to_string(uint value,char *pDst,uint len)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char buf [16];
  byte abStack_1c [12];
  
  abStack_1c[3] = 0;
  lVar3 = -1;
  do {
    lVar2 = lVar3;
    abStack_1c[lVar2 + 3] = (char)value + (char)(value / 10) * -10 | 0x30;
    lVar3 = lVar2 + -1;
    bVar1 = 9 < value;
    value = value / 10;
  } while (bVar1);
  uVar4 = -lVar3;
  uVar5 = (ulong)len;
  if (uVar4 < uVar5 || -uVar5 == lVar3) {
    memcpy(pDst,abStack_1c + lVar2 + 3,uVar4 + (uVar4 == 0));
  }
  return uVar4 < uVar5 || -uVar5 == lVar3;
}

Assistant:

bool uint_to_string(uint value, char* pDst, uint len)
    {
        CRNLIB_ASSERT(pDst);

        const uint cBufSize = 16;
        char buf[cBufSize];

        char* p = buf + cBufSize - 1;

        *p-- = '\0';

        do
        {
            *p-- = static_cast<uint8>('0' + (value % 10));
            value /= 10;
        } while (value);

        const size_t total_bytes = (buf + cBufSize - 1) - p;
        if (total_bytes > len)
        {
            return false;
        }

        for (size_t i = 0; i < total_bytes; i++)
        {
            pDst[i] = p[1 + i];
        }

        return true;
    }